

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O3

void __thiscall glcts::AdjacencyTestData::~AdjacencyTestData(AdjacencyTestData *this)

{
  this->_vptr_AdjacencyTestData = (_func_int **)&PTR__AdjacencyTestData_02115040;
  if (this->m_expected_adjacency_geometry != (GLfloat *)0x0) {
    operator_delete__(this->m_expected_adjacency_geometry);
    this->m_expected_adjacency_geometry = (GLfloat *)0x0;
  }
  if (this->m_expected_geometry != (GLfloat *)0x0) {
    operator_delete__(this->m_expected_geometry);
    this->m_expected_geometry = (GLfloat *)0x0;
  }
  if (this->m_vertex_data != (GLfloat *)0x0) {
    operator_delete__(this->m_vertex_data);
    this->m_vertex_data = (GLfloat *)0x0;
  }
  if (this->m_index_data != (GLuint *)0x0) {
    operator_delete__(this->m_index_data);
    this->m_index_data = (GLuint *)0x0;
  }
  if (this->m_grid != (AdjacencyGrid *)0x0) {
    (*this->m_grid->_vptr_AdjacencyGrid[1])();
    this->m_grid = (AdjacencyGrid *)0x0;
  }
  return;
}

Assistant:

AdjacencyTestData::~AdjacencyTestData()
{
	if (m_expected_adjacency_geometry)
	{
		delete[] m_expected_adjacency_geometry;
		m_expected_adjacency_geometry = 0;
	}

	if (m_expected_geometry)
	{
		delete[] m_expected_geometry;
		m_expected_geometry = 0;
	}

	if (m_vertex_data)
	{
		delete[] m_vertex_data;
		m_vertex_data = 0;
	}

	if (m_index_data)
	{
		delete[] m_index_data;
		m_index_data = 0;
	}

	if (m_grid)
	{
		delete m_grid;
		m_grid = 0;
	}
}